

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_buffer_method_get(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef *pTVar5;
  IRRef1 IVar6;
  long lVar7;
  IRRef1 IVar8;
  
  TVar2 = recff_sbufx_check(J,rd,0);
  IVar6 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op1 = IVar6;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar6;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090010;
  TVar3 = lj_opt_fold(J);
  pTVar5 = J->base;
  if (pTVar5[1] == 0) {
    pTVar5[1] = 0x7fff;
    pTVar5[2] = 0;
  }
  lVar7 = 0;
  while (uVar1 = pTVar5[lVar7 + 1], uVar1 != 0) {
    (J->fold).ins.field_0.ot = 0x2a15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    IVar8 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = IVar8;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
    TVar2 = lj_opt_fold(J);
    if ((uVar1 & 0x1f000000) == 0) {
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      TVar2 = lj_opt_fold(J);
      J->base[lVar7] = TVar2;
      TVar2 = TVar3;
      IVar8 = (IRRef1)TVar3;
    }
    else {
      TVar4 = recff_sbufx_checkint(J,rd,(int)lVar7 + 1);
      (J->fold).ins.field_0.ot = 0x3213;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar2 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold(J);
      J->base[lVar7] = TVar4;
      IVar8 = (IRRef1)TVar2;
    }
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090015;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar8;
    lj_opt_fold(J);
    lVar7 = lVar7 + 1;
    pTVar5 = J->base;
  }
  rd->nres = lVar7;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_get(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) { J->base[1] = TREF_NIL; J->base[2] = 0; }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    TRef len = recff_sbufx_len(J, trr, trw);
    if (tref_isnil(tr)) {
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = trw;
    } else {
      TRef trn = recff_sbufx_checkint(J, rd, arg+1);
      TRef tru;
      len = emitir(IRTI(IR_MIN), len, trn);
      tru = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = tru;  /* Doing the ADD before the SNEW generates better code. */
    }
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
  }
  rd->nres = arg;
}